

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

Regexp * __thiscall duckdb_re2::Regexp::Simplify(Regexp *this)

{
  Regexp *re;
  Regexp *this_00;
  SimplifyWalker sw;
  CoalesceWalker cw;
  Walker<duckdb_re2::Regexp_*> local_d0;
  Walker<duckdb_re2::Regexp_*> local_70;
  
  CoalesceWalker::CoalesceWalker((CoalesceWalker *)&local_70);
  re = Walker<duckdb_re2::Regexp_*>::Walk(&local_70,this,(Regexp *)0x0);
  if (re != (Regexp *)0x0) {
    if (local_70.stopped_early_ != true) {
      SimplifyWalker::SimplifyWalker((SimplifyWalker *)&local_d0);
      this_00 = Walker<duckdb_re2::Regexp_*>::Walk(&local_d0,re,(Regexp *)0x0);
      Decref(re);
      if (this_00 == (Regexp *)0x0) {
LAB_01b2b91d:
        this_00 = (Regexp *)0x0;
      }
      else if (local_d0.stopped_early_ == true) {
        Decref(this_00);
        goto LAB_01b2b91d;
      }
      Walker<duckdb_re2::Regexp_*>::~Walker(&local_d0);
      goto LAB_01b2b929;
    }
    Decref(re);
  }
  this_00 = (Regexp *)0x0;
LAB_01b2b929:
  Walker<duckdb_re2::Regexp_*>::~Walker(&local_70);
  return this_00;
}

Assistant:

Regexp* Regexp::Simplify() {
  CoalesceWalker cw;
  Regexp* cre = cw.Walk(this, NULL);
  if (cre == NULL)
    return NULL;
  if (cw.stopped_early()) {
    cre->Decref();
    return NULL;
  }
  SimplifyWalker sw;
  Regexp* sre = sw.Walk(cre, NULL);
  cre->Decref();
  if (sre == NULL)
    return NULL;
  if (sw.stopped_early()) {
    sre->Decref();
    return NULL;
  }
  return sre;
}